

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterBase.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscWriterBase::SscWriterBase
          (SscWriterBase *this,IO *io,string *name,Mode mode,MPI_Comm comm)

{
  bool *pbVar1;
  pointer pcVar2;
  uint8_t *puVar3;
  map *pmVar4;
  int providedMpiMode;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_SscWriterBase = (_func_int **)&PTR__SscWriterBase_00165070;
  puVar3 = (uint8_t *)malloc(1);
  (this->m_Buffer).m_Buffer = puVar3;
  (this->m_Buffer).m_Capacity = 1;
  (this->m_Buffer).m_Size = 0;
  this->m_CurrentStep = -1;
  local_38 = &(this->m_Name).field_2;
  (this->m_Name)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Name,pcVar2,pcVar2 + name->_M_string_length);
  this->m_Verbosity = 0;
  this->m_OpenTimeoutSecs = 10;
  this->m_Threading = false;
  this->m_IO = io;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Verbose","");
  pmVar4 = (map *)(io + 0x60);
  adios2::helper::GetParameter<int>(pmVar4,(string *)local_58,&this->m_Verbosity);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Threading","");
  pbVar1 = &this->m_Threading;
  adios2::helper::GetParameter<bool>(pmVar4,(string *)local_58,pbVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"OpenTimeoutSecs","");
  adios2::helper::GetParameter<int>(pmVar4,(string *)local_58,&this->m_OpenTimeoutSecs);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  MPI_Query_thread(local_58);
  if ((*pbVar1 == true) && ((int)local_58[0] != 3)) {
    *pbVar1 = false;
  }
  SyncMpiPattern(this,comm);
  return;
}

Assistant:

SscWriterBase::SscWriterBase(IO &io, const std::string &name, const Mode mode, MPI_Comm comm)
: m_Name(name), m_IO(io)
{

    helper::GetParameter(io.m_Parameters, "Verbose", m_Verbosity);
    helper::GetParameter(io.m_Parameters, "Threading", m_Threading);
    helper::GetParameter(io.m_Parameters, "OpenTimeoutSecs", m_OpenTimeoutSecs);

    int providedMpiMode;
    MPI_Query_thread(&providedMpiMode);
    if (m_Threading && providedMpiMode != MPI_THREAD_MULTIPLE)
    {
        m_Threading = false;
    }

    SyncMpiPattern(comm);
}